

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_impl.hpp
# Opt level: O2

string * toml::format_error(string *__return_storage_ptr__,string *errkind,error_info *err)

{
  pointer ppVar1;
  bool bVar2;
  size_t lnw;
  ostream *poVar3;
  char c;
  pointer ppVar4;
  pointer loc;
  string prev_fname;
  string local_1c8;
  ostringstream oss;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (errkind->_M_string_length != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)errkind);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,' ');
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,'\n');
  _oss = (pointer)err;
  lnw = format_error::anon_class_8_1_ba1d44c5::operator()((anon_class_8_1_ba1d44c5 *)&oss);
  prev_fname._M_dataplus._M_p = (pointer)&prev_fname.field_2;
  prev_fname._M_string_length = 0;
  prev_fname.field_2._M_local_buf[0] = '\0';
  ppVar1 = (err->locations_).
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  ppVar4 = ppVar1;
  for (loc = (err->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; c = (char)ppVar4, loc != ppVar1;
      loc = loc + 1) {
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      detail::make_string_abi_cxx11_(&local_1c8,(detail *)(lnw + 1),0x20,c);
      poVar3 = (ostream *)std::operator<<((ostream *)&oss,(string *)&local_1c8);
      poVar3 = color::ansi::bold(poVar3);
      poVar3 = color::ansi::blue(poVar3);
      poVar3 = (ostream *)std::operator<<((ostream *)poVar3," |");
      poVar3 = color::ansi::reset(poVar3);
      poVar3 = color::ansi::bold(poVar3);
      poVar3 = (ostream *)std::operator<<((ostream *)poVar3," ...\n");
      color::ansi::reset(poVar3);
      std::__cxx11::string::~string((string *)&local_1c8);
      detail::make_string_abi_cxx11_(&local_1c8,(detail *)(lnw + 1),0x20,c);
      poVar3 = (ostream *)std::operator<<((ostream *)&oss,(string *)&local_1c8);
      poVar3 = color::ansi::bold(poVar3);
      poVar3 = color::ansi::blue(poVar3);
      poVar3 = (ostream *)std::operator<<((ostream *)poVar3," |\n");
      color::ansi::reset(poVar3);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::stringbuf::str();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    }
    ppVar4 = loc;
    detail::format_location_impl((string *)&oss,lnw,&prev_fname,&loc->first,&loc->second);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prev_fname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(loc->first).file_name_);
    bVar2 = false;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err->suffix_);
  std::__cxx11::string::~string((string *)&prev_fname);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string format_error(const std::string& errkind, const error_info& err)
{
    std::string errmsg;
    if( ! errkind.empty())
    {
        errmsg = errkind;
        errmsg += ' ';
    }
    errmsg += err.title();
    errmsg += '\n';

    const auto lnw = [&err]() {
        std::size_t width = 0;
        for(const auto& l : err.locations())
        {
            width = (std::max)(detail::integer_width_base10(l.first.last_line_number()), width);
        }
        return width;
    }();

    bool first = true;
    std::string prev_fname;
    for(const auto& lm : err.locations())
    {
        if( ! first)
        {
            std::ostringstream oss;
            oss << detail::make_string(lnw + 1, ' ')
                << color::bold << color::blue << " |" << color::reset
                << color::bold << " ...\n" << color::reset;
            oss << detail::make_string(lnw + 1, ' ')
                << color::bold << color::blue << " |\n" << color::reset;
            errmsg += oss.str();
        }

        const auto& l = lm.first;
        const auto& m = lm.second;

        errmsg += detail::format_location_impl(lnw, prev_fname, l, m);

        prev_fname = l.file_name();
        first = false;
    }

    errmsg += err.suffix();

    return errmsg;
}